

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O0

bool __thiscall
glslang::TParseVersions::checkExtensionsRequested
          (TParseVersions *this,TSourceLoc *loc,int numExtensions,char **extensions,
          char *featureDesc)

{
  TInfoSink *this_00;
  bool bVar1;
  char *pcVar2;
  pool_allocator<char> local_f8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_78;
  int local_4c;
  int local_48;
  TExtensionBehavior behavior_1;
  int i_1;
  int iStack_3c;
  bool warned;
  TExtensionBehavior behavior;
  int i;
  char *featureDesc_local;
  char **extensions_local;
  TSourceLoc *pTStack_20;
  int numExtensions_local;
  TSourceLoc *loc_local;
  TParseVersions *this_local;
  
  iStack_3c = 0;
  _behavior = featureDesc;
  featureDesc_local = (char *)extensions;
  extensions_local._4_4_ = numExtensions;
  pTStack_20 = loc;
  loc_local = (TSourceLoc *)this;
  while( true ) {
    if (extensions_local._4_4_ <= iStack_3c) {
      behavior_1._3_1_ = EBhMissing >> 0x18;
      for (local_48 = 0; local_48 < extensions_local._4_4_; local_48 = local_48 + 1) {
        local_4c = (*this->_vptr_TParseVersions[7])
                             (this,*(undefined8 *)(featureDesc_local + (long)local_48 * 8));
        if ((local_4c == 4) && (bVar1 = relaxedErrors(this), bVar1)) {
          TInfoSinkBase::message
                    (&this->infoSink->info,EPrefixWarning,
                     "The following extension must be enabled to use this feature:",pTStack_20,
                     (this->messages & EShMsgAbsolutePath) != EShMsgDefault,
                     (this->messages & EShMsgDisplayErrorColumn) != EShMsgDefault);
          local_4c = 3;
        }
        if (local_4c == 3) {
          this_00 = this->infoSink;
          pcVar2 = *(char **)(featureDesc_local + (long)local_48 * 8);
          pool_allocator<char>::pool_allocator(&local_f8);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_f0,pcVar2,&local_f8);
          std::operator+(&local_c8,"extension ",&local_f0);
          std::operator+(&local_a0,&local_c8," is being used for ");
          std::operator+(&local_78,&local_a0,_behavior);
          pcVar2 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             (&local_78);
          TInfoSinkBase::message
                    (&this_00->info,EPrefixWarning,pcVar2,pTStack_20,
                     (this->messages & EShMsgAbsolutePath) != EShMsgDefault,
                     (this->messages & EShMsgDisplayErrorColumn) != EShMsgDefault);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_78);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_a0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_c8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_f0);
          behavior_1._3_1_ = 1;
        }
      }
      return (behavior_1._3_1_ & 1) != EBhMissing >> 0x18;
    }
    i_1 = (*this->_vptr_TParseVersions[7])
                    (this,*(undefined8 *)(featureDesc_local + (long)iStack_3c * 8));
    if ((i_1 == 2) || (i_1 == 1)) break;
    iStack_3c = iStack_3c + 1;
  }
  return true;
}

Assistant:

bool TParseVersions::checkExtensionsRequested(const TSourceLoc& loc, int numExtensions, const char* const extensions[], const char* featureDesc)
{
    // First, see if any of the extensions are enabled
    for (int i = 0; i < numExtensions; ++i) {
        TExtensionBehavior behavior = getExtensionBehavior(extensions[i]);
        if (behavior == EBhEnable || behavior == EBhRequire)
            return true;
    }

    // See if any extensions want to give a warning on use; give warnings for all such extensions
    bool warned = false;
    for (int i = 0; i < numExtensions; ++i) {
        TExtensionBehavior behavior = getExtensionBehavior(extensions[i]);
        if (behavior == EBhDisable && relaxedErrors()) {
            infoSink.info.message(EPrefixWarning, "The following extension must be enabled to use this feature:", loc,
                                  messages & EShMsgAbsolutePath, messages & EShMsgDisplayErrorColumn);
            behavior = EBhWarn;
        }
        if (behavior == EBhWarn) {
            infoSink.info.message(EPrefixWarning,
                                  ("extension " + TString(extensions[i]) + " is being used for " + featureDesc).c_str(),
                                  loc, messages & EShMsgAbsolutePath, messages & EShMsgDisplayErrorColumn);
            warned = true;
        }
    }
    if (warned)
        return true;
    return false;
}